

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_signal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  JSValueUnion JVar2;
  long lVar3;
  JSValueUnion JVar4;
  undefined1 auVar5 [16];
  int iVar6;
  undefined8 in_RAX;
  JSRuntime *pJVar7;
  void *pvVar8;
  void *pvVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  char *fmt;
  code *__handler;
  JSRefCountHeader *p_1;
  JSOSSignalHandler *sh;
  uint uVar13;
  JSValue v;
  JSValue JVar14;
  JSValue JVar15;
  uint32_t sig_num;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  pJVar7 = JS_GetRuntime(ctx);
  pvVar8 = JS_GetRuntimeOpaque(pJVar7);
  pvVar9 = JS_GetRuntimeOpaque(pJVar7);
  if (*(long *)((long)pvVar9 + 0x48) == 0) {
    iVar6 = JS_ToInt32(ctx,(int32_t *)&local_34,*argv);
    uVar11 = 6;
    if (iVar6 == 0) {
      if (0x3f < local_34) {
        JVar14 = JS_ThrowRangeError(ctx,"invalid signal number");
        goto LAB_00112d5d;
      }
      lVar1 = argv[1].tag;
      uVar13 = (uint)lVar1;
      if ((uVar13 & 0xfffffffe) == 2) {
        for (sh = *(JSOSSignalHandler **)((long)pvVar8 + 0x18);
            sh != (JSOSSignalHandler *)((long)pvVar8 + 0x10);
            sh = (JSOSSignalHandler *)(sh->link).next) {
          if (sh->sig_num == local_34) {
            pJVar7 = JS_GetRuntime(ctx);
            free_sh(pJVar7,sh);
            break;
          }
        }
        __handler = (code *)(ulong)(uVar13 != 2);
      }
      else {
        JVar2 = (JSValueUnion)argv[1].u.ptr;
        JVar14.tag = lVar1;
        JVar14.u.ptr = JVar2.ptr;
        iVar6 = JS_IsFunction(ctx,JVar14);
        if (iVar6 == 0) {
          fmt = "not a function";
          goto LAB_00112d53;
        }
        plVar12 = (long *)((long)pvVar8 + 0x10);
        for (plVar10 = *(long **)((long)pvVar8 + 0x18); plVar10 != plVar12;
            plVar10 = (long *)plVar10[1]) {
          if (*(uint *)(plVar10 + 2) == local_34) goto LAB_00112e70;
        }
        plVar10 = (long *)js_mallocz(ctx,0x28);
        if (plVar10 == (long *)0x0) goto LAB_00112d8f;
        *(uint *)(plVar10 + 2) = local_34;
        lVar3 = *plVar12;
        *(long **)(lVar3 + 8) = plVar10;
        *plVar10 = lVar3;
        plVar10[1] = (long)plVar12;
        *plVar12 = (long)plVar10;
LAB_00112e70:
        lVar3 = plVar10[4];
        if (0xfffffff4 < (uint)lVar3) {
          JVar4 = (JSValueUnion)((JSValueUnion *)(plVar10 + 3))->ptr;
          iVar6 = *JVar4.ptr;
          *(int *)JVar4.ptr = iVar6 + -1;
          if (iVar6 < 2) {
            v.tag = lVar3;
            v.u.ptr = JVar4.ptr;
            __JS_FreeValue(ctx,v);
          }
        }
        if (0xfffffff4 < uVar13) {
          *(int *)JVar2.ptr = *JVar2.ptr + 1;
        }
        ((JSValueUnion *)(plVar10 + 3))->ptr = (void *)JVar2;
        plVar10[4] = lVar1;
        __handler = os_signal_handler;
      }
      signal(local_34,__handler);
      uVar11 = 3;
    }
LAB_00112d8f:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar11;
    JVar14 = (JSValue)(auVar5 << 0x40);
    uVar11 = 0;
  }
  else {
    fmt = "signal handler can only be set in the main thread";
LAB_00112d53:
    JVar14 = JS_ThrowTypeError(ctx,fmt);
LAB_00112d5d:
    uVar11 = (ulong)JVar14.u.ptr & 0xffffffff00000000;
  }
  JVar15.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar11);
  JVar15.tag = JVar14.tag;
  return JVar15;
}

Assistant:

static JSValue js_os_signal(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    JSOSSignalHandler *sh;
    uint32_t sig_num;
    JSValueConst func;
    sighandler_t handler;

    if (!is_main_thread(rt))
        return JS_ThrowTypeError(ctx, "signal handler can only be set in the main thread");
    
    if (JS_ToUint32(ctx, &sig_num, argv[0]))
        return JS_EXCEPTION;
    if (sig_num >= 64)
        return JS_ThrowRangeError(ctx, "invalid signal number");
    func = argv[1];
    /* func = null: SIG_DFL, func = undefined, SIG_IGN */
    if (JS_IsNull(func) || JS_IsUndefined(func)) {
        sh = find_sh(ts, sig_num);
        if (sh) {
            free_sh(JS_GetRuntime(ctx), sh);
        }
        if (JS_IsNull(func))
            handler = SIG_DFL;
        else
            handler = SIG_IGN;
        signal(sig_num, handler);
    } else {
        if (!JS_IsFunction(ctx, func))
            return JS_ThrowTypeError(ctx, "not a function");
        sh = find_sh(ts, sig_num);
        if (!sh) {
            sh = js_mallocz(ctx, sizeof(*sh));
            if (!sh)
                return JS_EXCEPTION;
            sh->sig_num = sig_num;
            list_add_tail(&sh->link, &ts->os_signal_handlers);
        }
        JS_FreeValue(ctx, sh->func);
        sh->func = JS_DupValue(ctx, func);
        signal(sig_num, os_signal_handler);
    }
    return JS_UNDEFINED;
}